

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

void __thiscall sznet::net::TcpConnection::connectEstablished(TcpConnection *this)

{
  uint *puVar1;
  EventLoop *this_00;
  Channel *pCVar2;
  bool bVar3;
  undefined1 local_40 [16];
  shared_ptr<sznet::net::TcpConnection> local_30;
  
  this_00 = this->m_loop;
  bVar3 = EventLoop::isInLoopThread(this_00);
  if (!bVar3) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  if (this->m_state == kConnecting) {
    this->m_state = kConnected;
    pCVar2 = (this->m_channel)._M_t.
             super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
             _M_t.
             super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
             .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
    std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::TcpConnection,void>
              ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)local_40,
               (__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    local_30.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_40._0_8_;
    local_30.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_;
    local_40 = ZEXT816(0) << 0x20;
    Channel::tie(pCVar2,(shared_ptr<void> *)&local_30);
    if (local_30.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
    }
    pCVar2 = (this->m_channel)._M_t.
             super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
             _M_t.
             super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
             .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
    puVar1 = &pCVar2->m_events;
    *puVar1 = *puVar1 | 1;
    Channel::update(pCVar2);
    if ((this->m_connectionCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<sznet::net::TcpConnection,void>
                ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_30,
                 (__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
      if ((this->m_connectionCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->m_connectionCallback)._M_invoker)((_Any_data *)&this->m_connectionCallback,&local_30)
      ;
      if (local_30.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_30.
                   super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    return;
  }
  __assert_fail("m_state == kConnecting",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                ,0x128,"void sznet::net::TcpConnection::connectEstablished()");
}

Assistant:

void TcpConnection::connectEstablished()
{
	m_loop->assertInLoopThread();
	assert(m_state == kConnecting);
	setState(kConnected);
	m_channel->tie(shared_from_this());
	m_channel->enableReading();

	if (m_connectionCallback)
	{
		m_connectionCallback(shared_from_this());
	}
}